

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgstrs.c
# Opt level: O3

void dgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  double *pdVar5;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  double *Mxvec;
  double *addr;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong n;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  ulong local_1c8;
  int ii;
  
  *info = 0;
  if (CONJ < trans) {
    ii = 1;
    iVar20 = -1;
LAB_001060b4:
    *info = iVar20;
    input_error("dgstrs",&ii);
    return;
  }
  uVar1 = L->nrow;
  n = (ulong)uVar1;
  ii = 2;
  iVar20 = -2;
  if (((((int)uVar1 < 0) || (uVar1 != L->ncol)) || (L->Stype != SLU_SC)) ||
     ((L->Dtype != SLU_D || (L->Mtype != SLU_TRLU)))) goto LAB_001060b4;
  ii = 3;
  iVar20 = -3;
  if (((U->nrow < 0) || ((U->nrow != U->ncol || (U->Stype != SLU_NC)))) ||
     ((U->Dtype != SLU_D || (U->Mtype != SLU_TRU)))) goto LAB_001060b4;
  puVar4 = (uint *)B->Store;
  uVar15 = *puVar4;
  lVar19 = (long)(int)uVar15;
  ii = 6;
  iVar20 = -6;
  if (((((int)uVar15 < (int)uVar1) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_D)) ||
     (B->Mtype != SLU_GE)) goto LAB_001060b4;
  uVar2 = B->ncol;
  uVar11 = (ulong)uVar2;
  Mxvec = doubleCalloc((long)(int)uVar2 * n);
  if (Mxvec == (double *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  addr = doubleMalloc(n);
  if (addr == (double *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  pdVar5 = *(double **)(puVar4 + 2);
  if (trans == NOTRANS) {
    pvVar6 = L->Store;
    lVar7 = *(long *)((long)pvVar6 + 8);
    pvVar8 = U->Store;
    lVar9 = *(long *)((long)pvVar8 + 8);
    if (0 < (int)uVar2) {
      uVar12 = 0;
      pdVar14 = pdVar5;
      do {
        if (uVar1 != 0) {
          uVar16 = 0;
          do {
            addr[perm_r[uVar16]] = pdVar14[uVar16];
            uVar16 = uVar16 + 1;
          } while (n != uVar16);
          if (uVar1 != 0) {
            uVar16 = 0;
            do {
              pdVar14[uVar16] = addr[uVar16];
              uVar16 = uVar16 + 1;
            } while (n != uVar16);
          }
        }
        uVar12 = uVar12 + 1;
        pdVar14 = pdVar14 + uVar15;
      } while (uVar12 != uVar11);
    }
    uVar12 = (ulong)*(uint *)((long)pvVar6 + 4);
    if ((int)*(uint *)((long)pvVar6 + 4) < 0) {
      fVar29 = 0.0;
    }
    else {
      fVar29 = 0.0;
      lVar13 = 0;
      do {
        lVar22 = (long)*(int *)(*(long *)((long)pvVar6 + 0x30) + lVar13 * 4);
        uVar15 = *(uint *)(*(long *)((long)pvVar6 + 0x20) + lVar22 * 4);
        iVar20 = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + lVar22 * 4);
        iVar23 = iVar20 - uVar15;
        lVar21 = *(int *)(*(long *)((long)pvVar6 + 0x30) + 4 + lVar13 * 4) - lVar22;
        iVar25 = (int)lVar21;
        iVar18 = iVar23 - iVar25;
        if (iVar25 == 1) {
          if (0 < (int)uVar2) {
            iVar23 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar22 * 4);
            uVar16 = 0;
            do {
              if ((int)(uVar15 + 1) < iVar20) {
                lVar24 = uVar16 * lVar19;
                lVar21 = *(long *)((long)pvVar6 + 0x18);
                lVar26 = 0;
                do {
                  lVar27 = (long)*(int *)(lVar21 + (long)(int)uVar15 * 4 + 4 + lVar26 * 4);
                  pdVar5[lVar24 + lVar27] =
                       pdVar5[lVar24 + lVar27] -
                       pdVar5[lVar24 + lVar22] *
                       *(double *)(lVar7 + 8 + (long)iVar23 * 8 + lVar26 * 8);
                  lVar26 = lVar26 + 1;
                } while (~uVar15 + iVar20 != (int)lVar26);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar11);
          }
        }
        else if (0 < (int)uVar2) {
          lVar24 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar22 * 4);
          uVar12 = 0;
          do {
            lVar26 = uVar12 * lVar19;
            dlsolve(iVar23,iVar25,(double *)(lVar7 + lVar24 * 8),pdVar5 + lVar26 + lVar22);
            dmatvec(iVar23,iVar18,iVar25,(double *)(lVar7 + (lVar21 + lVar24) * 8),
                    pdVar5 + lVar26 + lVar22,Mxvec);
            if (0 < iVar18) {
              lVar27 = *(long *)((long)pvVar6 + 0x18);
              lVar28 = 0;
              do {
                lVar17 = (long)*(int *)(lVar27 + (long)(int)(uVar15 + iVar25) * 4 + lVar28 * 4);
                pdVar5[lVar26 + lVar17] = pdVar5[lVar26 + lVar17] - Mxvec[lVar28];
                Mxvec[lVar28] = 0.0;
                lVar28 = lVar28 + 1;
              } while (lVar28 < iVar18);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar11);
          uVar12 = (ulong)*(uint *)((long)pvVar6 + 4);
        }
        fVar29 = (float)(int)(uVar2 * 2 * iVar25 * iVar18) +
                 fVar29 + (float)(int)(iVar25 * uVar2 * (iVar25 + -1));
        bVar10 = lVar13 < (int)uVar12;
        lVar13 = lVar13 + 1;
      } while (bVar10);
      if (-1 < (int)uVar12) {
        do {
          iVar20 = *(int *)(*(long *)((long)pvVar6 + 0x30) + uVar12 * 4);
          lVar21 = (long)iVar20;
          iVar18 = *(int *)(*(long *)((long)pvVar6 + 0x30) + 4 + uVar12 * 4);
          iVar25 = iVar18 - iVar20;
          lVar13 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar21 * 4);
          fVar29 = (float)(int)(iVar25 * uVar2 * (iVar25 + 1)) + fVar29;
          if (iVar25 == 1) {
            if (0 < (int)uVar2) {
              pdVar14 = pdVar5 + lVar21;
              uVar16 = uVar11;
              do {
                *pdVar14 = *pdVar14 / *(double *)(lVar7 + lVar13 * 8);
                pdVar14 = pdVar14 + lVar19;
                uVar15 = (int)uVar16 - 1;
                uVar16 = (ulong)uVar15;
              } while (uVar15 != 0);
LAB_00106801:
              if (0 < (int)uVar2) {
                uVar16 = 0;
                do {
                  if (iVar20 < iVar18) {
                    lVar24 = uVar16 * lVar19;
                    lVar13 = *(long *)((long)pvVar8 + 0x18);
                    lVar22 = lVar21;
                    iVar25 = *(int *)(lVar13 + lVar21 * 4);
                    do {
                      iVar23 = *(int *)(lVar13 + 4 + lVar22 * 4);
                      if (iVar23 - iVar25 != 0 && iVar25 <= iVar23) {
                        lVar26 = *(long *)((long)pvVar8 + 0x10);
                        lVar27 = (long)iVar25;
                        do {
                          lVar28 = (long)*(int *)(lVar26 + lVar27 * 4);
                          pdVar5[lVar24 + lVar28] =
                               pdVar5[lVar24 + lVar28] -
                               pdVar5[lVar24 + lVar22] * *(double *)(lVar9 + lVar27 * 8);
                          lVar27 = lVar27 + 1;
                        } while (iVar23 != lVar27);
                      }
                      lVar22 = lVar22 + 1;
                      fVar29 = fVar29 + (float)((iVar23 - iVar25) * 2);
                      iVar25 = iVar23;
                    } while (lVar22 != iVar18);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != uVar11);
              }
            }
          }
          else if (0 < (int)uVar2) {
            iVar23 = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + lVar21 * 4);
            iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar21 * 4);
            pdVar14 = pdVar5 + lVar21;
            uVar16 = uVar11;
            do {
              dusolve(iVar23 - iVar3,iVar25,(double *)(lVar7 + lVar13 * 8),pdVar14);
              pdVar14 = pdVar14 + lVar19;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            goto LAB_00106801;
          }
          bVar10 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar10);
      }
    }
    if (0 < (int)uVar2) {
      uVar12 = 0;
      pdVar14 = pdVar5;
      do {
        if (0 < (int)uVar1) {
          uVar16 = 0;
          do {
            addr[uVar16] = pdVar5[uVar12 * lVar19 + (long)perm_c[uVar16]];
            uVar16 = uVar16 + 1;
          } while (n != uVar16);
          if (0 < (int)uVar1) {
            uVar16 = 0;
            do {
              pdVar14[uVar16] = addr[uVar16];
              uVar16 = uVar16 + 1;
            } while (n != uVar16);
          }
        }
        uVar12 = uVar12 + 1;
        pdVar14 = pdVar14 + lVar19;
      } while (uVar12 != uVar11);
    }
  }
  else {
    if (0 < (int)uVar2) {
      uVar12 = 0;
      pdVar14 = pdVar5;
      do {
        if (n != 0) {
          uVar16 = 0;
          do {
            addr[perm_c[uVar16]] = pdVar14[uVar16];
            uVar16 = uVar16 + 1;
          } while (n != uVar16);
          if (n != 0) {
            uVar16 = 0;
            do {
              pdVar14[uVar16] = addr[uVar16];
              uVar16 = uVar16 + 1;
            } while (n != uVar16);
          }
        }
        uVar12 = uVar12 + 1;
        pdVar14 = pdVar14 + uVar15;
      } while (uVar12 != uVar11);
      stat->ops[0x11] = 0.0;
      pdVar14 = pdVar5;
      local_1c8 = uVar11;
      if (0 < (int)uVar2) {
        do {
          sp_dtrsv("U","T","N",L,U,pdVar14,stat,info);
          sp_dtrsv("L","T","U",L,U,pdVar14,stat,info);
          local_1c8 = local_1c8 - 1;
          pdVar14 = pdVar14 + lVar19;
        } while (local_1c8 != 0);
        if (0 < (int)uVar2) {
          uVar12 = 0;
          pdVar14 = pdVar5;
          do {
            if (0 < (int)uVar1) {
              uVar16 = 0;
              do {
                addr[uVar16] = pdVar5[uVar12 * lVar19 + (long)perm_r[uVar16]];
                uVar16 = uVar16 + 1;
              } while (n != uVar16);
              if (0 < (int)uVar1) {
                uVar16 = 0;
                do {
                  pdVar14[uVar16] = addr[uVar16];
                  uVar16 = uVar16 + 1;
                } while (n != uVar16);
              }
            }
            uVar12 = uVar12 + 1;
            pdVar14 = pdVar14 + lVar19;
          } while (uVar12 != uVar11);
        }
      }
      goto LAB_00106960;
    }
    fVar29 = 0.0;
  }
  stat->ops[0x11] = fVar29;
LAB_00106960:
  superlu_free(Mxvec);
  superlu_free(addr);
  return;
}

Assistant:

void
dgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    double   alpha = 1.0, beta = 1.0;
    double   *work_col;
#endif
    DNformat *Bstore;
    double   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    double   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    double   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void dprint_soln(int n, int nrhs, const double *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_D || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_D || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_D || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("dgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doubleCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doubleMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		dtrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		dgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    dlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    dmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	dprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		dtrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    dusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	dprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_dtrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_dtrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}